

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

bool __thiscall gpu::Context::isIntelGPU(Context *this)

{
  Type TVar1;
  element_type *this_00;
  DeviceInfo *this_01;
  Context local_28;
  Context *this_local;
  
  local_28.data_ref_.super___shared_ptr<gpu::Context::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  TVar1 = type(this);
  if (TVar1 == TypeOpenCL) {
    cl(&local_28);
    this_00 = std::__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<ocl::OpenCLEngine,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&local_28);
    this_01 = ocl::OpenCLEngine::deviceInfo(this_00);
    this_local._7_1_ = ocl::DeviceInfo::isIntelGPU(this_01);
    std::shared_ptr<ocl::OpenCLEngine>::~shared_ptr((shared_ptr<ocl::OpenCLEngine> *)&local_28);
  }
  else {
    this_local._7_1_ = 0;
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Context::isIntelGPU()
{
	if (type() != TypeOpenCL) {
		return false;
	}

	return cl()->deviceInfo().isIntelGPU();
}